

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionContext_SequenceApiTestWithKey_Test::TestBody
          (ConfidentialTransactionContext_SequenceApiTestWithKey_Test *this)

{
  initializer_list<cfd::UtxoData> __l;
  undefined1 uVar1;
  bool bVar2;
  char *pcVar3;
  size_type sVar4;
  size_t sVar5;
  char *in_R9;
  Amount AVar6;
  AssertionResult gtest_ar_1;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  ByteData tx;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  txouts;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ct_addrs;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ConfidentialTransactionContext txc;
  Amount fee;
  ElementsConfidentialAddress asset_address;
  ElementsConfidentialAddress address;
  UtxoData utxo2;
  UtxoData utxo1;
  ElementsAddressFactory factory;
  ConfidentialTxOutReference *in_stack_ffffffffffffd978;
  undefined7 in_stack_ffffffffffffd980;
  undefined1 in_stack_ffffffffffffd987;
  UtxoData *in_stack_ffffffffffffd988;
  ConfidentialTransactionContext *in_stack_ffffffffffffd990;
  char *in_stack_ffffffffffffd998;
  undefined4 in_stack_ffffffffffffd9a8;
  undefined1 in_stack_ffffffffffffd9ac;
  undefined1 in_stack_ffffffffffffd9ad;
  undefined1 in_stack_ffffffffffffd9ae;
  undefined1 in_stack_ffffffffffffd9af;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffd9b0;
  allocator *paVar7;
  undefined4 in_stack_ffffffffffffd9b8;
  NetType in_stack_ffffffffffffd9bc;
  undefined2 in_stack_ffffffffffffd9c0;
  undefined1 in_stack_ffffffffffffd9c2;
  undefined1 in_stack_ffffffffffffd9c3;
  undefined1 in_stack_ffffffffffffd9c4;
  undefined1 in_stack_ffffffffffffd9c5;
  undefined1 in_stack_ffffffffffffd9c6;
  undefined1 in_stack_ffffffffffffd9c7;
  vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *in_stack_ffffffffffffd9d0;
  undefined1 in_stack_ffffffffffffd9d8;
  undefined1 in_stack_ffffffffffffd9d9;
  undefined1 in_stack_ffffffffffffd9da;
  undefined1 in_stack_ffffffffffffd9db;
  undefined1 in_stack_ffffffffffffd9dc;
  undefined1 in_stack_ffffffffffffd9dd;
  undefined1 in_stack_ffffffffffffd9de;
  undefined1 in_stack_ffffffffffffd9df;
  UtxoData *in_stack_ffffffffffffd9e0;
  undefined5 in_stack_ffffffffffffd9e8;
  undefined1 in_stack_ffffffffffffd9ed;
  undefined1 in_stack_ffffffffffffd9ee;
  undefined1 in_stack_ffffffffffffd9ef;
  UtxoData *in_stack_ffffffffffffd9f0;
  ConfidentialTransactionContext *pCVar8;
  undefined8 ****local_25c8;
  undefined6 in_stack_ffffffffffffda58;
  undefined1 in_stack_ffffffffffffda5e;
  Amount *value;
  ElementsConfidentialAddress *address_00;
  AssertHelper local_2538;
  Message local_2530;
  int *local_2528;
  undefined4 local_251c;
  AssertionResult local_2518;
  AssertHelper local_2508;
  Message local_2500 [4];
  AssertHelper local_24e0;
  Message local_24d8;
  OutPoint local_24d0;
  AssertHelper local_24a8;
  Message local_24a0;
  SigHashType local_2498;
  allocator local_2489;
  string local_2488;
  Privkey local_2468;
  allocator local_2441;
  string local_2440;
  Pubkey local_2420;
  OutPoint local_2408;
  AssertHelper local_23e0;
  Message local_23d8 [5];
  byte local_23a9;
  ConstCharPtr local_23a8;
  AssertHelper local_23a0;
  Message local_2398;
  OutPoint local_2390;
  AssertHelper local_2368;
  Message local_2360;
  SigHashType local_2358;
  allocator local_2349;
  string local_2348;
  Privkey local_2328;
  allocator local_2301;
  string local_2300;
  Pubkey local_22e0;
  OutPoint local_22c8;
  ByteData local_22a0;
  string local_2288;
  AssertHelper local_2268;
  Message local_2260;
  ConfidentialValue local_2258;
  byte local_2229;
  AssertionResult local_2228;
  string local_2218;
  AssertHelper local_21f8;
  Message local_21f0;
  ConfidentialValue local_21e8;
  undefined1 local_21b9;
  AssertionResult local_21b8;
  string local_21a8;
  AssertHelper local_2188;
  Message local_2180;
  ConfidentialValue local_2178;
  undefined1 local_2149;
  AssertionResult local_2148;
  AssertHelper local_2138;
  Message local_2130;
  undefined4 local_2124;
  size_type local_2120;
  AssertionResult local_2118;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  local_2108;
  AssertHelper local_20f0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffdf18;
  ConfidentialTransactionContext *in_stack_ffffffffffffdf20;
  undefined1 in_stack_ffffffffffffdf2f;
  pointer in_stack_ffffffffffffdf30;
  AssertHelper in_stack_ffffffffffffdf38;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffdf40;
  pointer in_stack_ffffffffffffdf48;
  ConfidentialTxOut *this_00;
  undefined8 ***local_20a8 [26];
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffe028;
  ConfidentialTransactionContext *in_stack_ffffffffffffe030;
  ConfidentialTxOut local_1bb8 [5];
  undefined1 ****local_16c8;
  undefined8 local_16c0;
  Address local_16a0;
  int64_t local_1528;
  undefined1 local_1520;
  int64_t local_1518;
  undefined1 local_1510;
  OutPoint local_1508;
  AssertHelper local_14e0;
  Message local_14d8 [2];
  ConfidentialTransaction local_14c8 [2];
  Amount local_1410;
  Amount local_13f9 [2];
  ElementsConfidentialAddress local_13d8;
  ElementsConfidentialAddress local_1221;
  undefined1 local_1049 [113];
  BlindFactor local_fd8;
  allocator local_fb1;
  string local_fb0;
  BlindFactor local_f90;
  allocator local_f69;
  string local_f68;
  ConfidentialAssetId local_f48;
  Amount local_f20;
  allocator local_f09;
  string local_f08 [32];
  Address local_ee8;
  allocator local_d69;
  string local_d68;
  Script local_d48;
  allocator local_d09;
  string local_d08;
  Txid local_ce8;
  undefined8 local_cc8;
  Txid local_ca0;
  uint32_t local_c80;
  Script local_c78 [2];
  Address local_c08;
  string local_a90 [32];
  int64_t local_a70;
  undefined1 local_a68;
  undefined4 local_a60;
  undefined8 local_a58;
  ConfidentialAssetId local_a50 [11];
  BlindFactor local_878;
  BlindFactor local_858;
  ConfidentialValue local_838 [2];
  allocator local_7d1;
  string local_7d0;
  ConfidentialAssetId local_7b0;
  Amount local_788;
  allocator local_771;
  string local_770 [32];
  Address local_750;
  allocator local_5d1;
  string local_5d0;
  Script local_5b0;
  allocator local_571;
  string local_570;
  Txid local_550;
  undefined8 local_520;
  Txid local_4f8;
  uint32_t local_4d8;
  Script local_4d0 [2];
  Address local_460;
  string local_2e8 [32];
  Amount local_2c8;
  undefined4 local_2b8;
  undefined8 local_2b0;
  ConfidentialAssetId local_2a8 [17];
  
  cfd::ElementsAddressFactory::ElementsAddressFactory
            ((ElementsAddressFactory *)
             CONCAT17(in_stack_ffffffffffffd9c7,
                      CONCAT16(in_stack_ffffffffffffd9c6,
                               CONCAT15(in_stack_ffffffffffffd9c5,
                                        CONCAT14(in_stack_ffffffffffffd9c4,
                                                 CONCAT13(in_stack_ffffffffffffd9c3,
                                                          CONCAT12(in_stack_ffffffffffffd9c2,
                                                                   in_stack_ffffffffffffd9c0)))))),
             in_stack_ffffffffffffd9bc);
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffd9e0);
  local_520 = 0;
  local_2b0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_570,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,&local_571);
  cfd::core::Txid::Txid(&local_550,&local_570);
  cfd::core::Txid::operator=(&local_4f8,&local_550);
  cfd::core::Txid::~Txid((Txid *)0x2258b6);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  local_4d8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5d0,"76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac",&local_5d1);
  cfd::core::Script::Script(&local_5b0,&local_5d0);
  cfd::core::Script::operator=(local_4d0,&local_5b0);
  cfd::core::Script::~Script
            ((Script *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980));
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_770,"2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph",&local_771);
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)in_stack_ffffffffffffd988,
             (string *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980));
  cfd::core::Address::operator=(&local_460,&local_750);
  cfd::core::Address::~Address
            ((Address *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980));
  std::__cxx11::string::~string(local_770);
  std::allocator<char>::~allocator((allocator<char> *)&local_771);
  std::__cxx11::string::operator=
            (local_2e8,"pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)");
  cfd::core::Amount::Amount(&local_788,10000000);
  local_2c8.ignore_check_ = local_788.ignore_check_;
  local_2c8.amount_ = local_788.amount_;
  local_2b8 = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_7d0,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,&local_7d1);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_7b0,&local_7d0);
  cfd::core::ConfidentialAssetId::operator=(local_2a8,&local_7b0);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x225ab4);
  std::__cxx11::string::~string((string *)&local_7d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffd9e0);
  local_cc8 = 0;
  local_a58 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d08,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3"
             ,&local_d09);
  cfd::core::Txid::Txid(&local_ce8,&local_d08);
  cfd::core::Txid::operator=(&local_ca0,&local_ce8);
  cfd::core::Txid::~Txid((Txid *)0x225b63);
  std::__cxx11::string::~string((string *)&local_d08);
  std::allocator<char>::~allocator((allocator<char> *)&local_d09);
  local_c80 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d68,"a9145d54db96a28f844a744e393fcd699d6f825b284187",&local_d69);
  cfd::core::Script::Script(&local_d48,&local_d68);
  cfd::core::Script::operator=(local_c78,&local_d48);
  cfd::core::Script::~Script
            ((Script *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980));
  std::__cxx11::string::~string((string *)&local_d68);
  std::allocator<char>::~allocator((allocator<char> *)&local_d69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f08,"XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE",&local_f09);
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)in_stack_ffffffffffffd988,
             (string *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980));
  cfd::core::Address::operator=(&local_c08,&local_ee8);
  cfd::core::Address::~Address
            ((Address *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980));
  std::__cxx11::string::~string(local_f08);
  std::allocator<char>::~allocator((allocator<char> *)&local_f09);
  std::__cxx11::string::operator=
            (local_a90,
             "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))");
  cfd::core::Amount::Amount(&local_f20,180000);
  local_a68 = local_f20.ignore_check_;
  local_a70 = local_f20.amount_;
  local_a60 = 6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_f68,"849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735"
             ,&local_f69);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_f48,&local_f68);
  cfd::core::ConfidentialAssetId::operator=(local_a50,&local_f48);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x225d61);
  std::__cxx11::string::~string((string *)&local_f68);
  std::allocator<char>::~allocator((allocator<char> *)&local_f69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_fb0,"23b44363de1069842dff58ac6c965f75af71949e58d823d7bfcc963134db0b3e"
             ,&local_fb1);
  cfd::core::BlindFactor::BlindFactor(&local_f90,&local_fb0);
  cfd::core::BlindFactor::operator=(&local_878,&local_f90);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x225de9);
  std::__cxx11::string::~string((string *)&local_fb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fb1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_1049 + 0x51),
             "6dfe8c49f10c40cac178da4056dbf55eb11fa26e3169f41019e88252d86c42bc",
             (allocator *)((long)local_1049 + 0x50));
  cfd::core::BlindFactor::BlindFactor(&local_fd8,(string *)(local_1049 + 0x51));
  cfd::core::BlindFactor::operator=(&local_858,&local_fd8);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x225e71);
  std::__cxx11::string::~string((string *)(local_1049 + 0x51));
  std::allocator<char>::~allocator((allocator<char> *)((long)local_1049 + 0x50));
  pCVar8 = (ConfidentialTransactionContext *)local_1049;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)((long)local_1049 + 1),
             "09da970d871982c2405b2d4bff4f455e4907bedaf95c205f94015809f6bd9c59fa",
             (allocator *)pCVar8);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)((long)local_1049 + 0x21),(string *)((long)local_1049 + 1));
  cfd::core::ConfidentialValue::operator=(local_838,(ConfidentialValue *)((long)local_1049 + 0x21));
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x225ef9);
  std::__cxx11::string::~string((string *)((long)local_1049 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1049);
  address_00 = &local_1221;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)((long)&local_1221.unblinded_address_.type_ + 1),
             "CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3ggeFikyDxDW5gU8WmTXtb2HWWjc23YXZz",
             (allocator *)address_00);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)
             ((long)local_1221.unblinded_address_.address_.field_2._M_local_buf + 1),
             (string *)((long)&local_1221.unblinded_address_.type_ + 1));
  std::__cxx11::string::~string((string *)((long)&local_1221.unblinded_address_.type_ + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_1221);
  value = local_13f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)((long)&local_13f9[0].amount_ + 1),
             "CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3VHXTF8dZAhKb1iBAnzYXEj527CSdfj2PS",
             (allocator *)value);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_13d8,(string *)((long)&local_13f9[0].amount_ + 1));
  std::__cxx11::string::~string((string *)((long)&local_13f9[0].amount_ + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_13f9);
  cfd::core::Amount::Amount(&local_1410,10000);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)
             CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980),
             (uint32_t)((ulong)in_stack_ffffffffffffd978 >> 0x20),
             (uint32_t)in_stack_ffffffffffffd978);
  uVar1 = testing::internal::AlwaysTrue();
  if ((bool)uVar1) {
    in_stack_ffffffffffffda5e = testing::internal::AlwaysTrue();
    if ((bool)in_stack_ffffffffffffda5e) {
      cfd::ConfidentialTransactionContext::AddInput
                (in_stack_ffffffffffffd990,in_stack_ffffffffffffd988);
    }
  }
  else {
    testing::Message::Message(local_14d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_14e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x2ff,
               "Expected: txc.AddInput(utxo1) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_14e0,local_14d8);
    testing::internal::AssertHelper::~AssertHelper(&local_14e0);
    testing::Message::~Message((Message *)0x2266b5);
  }
  cfd::core::OutPoint::OutPoint(&local_1508,&local_ca0,local_c80);
  cfd::ConfidentialTransactionContext::AddTxIn
            ((ConfidentialTransactionContext *)
             CONCAT17(in_stack_ffffffffffffd9c7,
                      CONCAT16(in_stack_ffffffffffffd9c6,
                               CONCAT15(in_stack_ffffffffffffd9c5,
                                        CONCAT14(in_stack_ffffffffffffd9c4,
                                                 CONCAT13(in_stack_ffffffffffffd9c3,
                                                          CONCAT12(in_stack_ffffffffffffd9c2,
                                                                   in_stack_ffffffffffffd9c0)))))),
             (OutPoint *)CONCAT44(in_stack_ffffffffffffd9bc,in_stack_ffffffffffffd9b8));
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x226742);
  AVar6 = cfd::core::operator-(&local_2c8,&local_1410);
  local_1528 = AVar6.amount_;
  local_1520 = AVar6.ignore_check_;
  local_1518 = local_1528;
  local_1510 = local_1520;
  cfd::ConfidentialTransactionContext::AddTxOut
            (pCVar8,address_00,value,
             (ConfidentialAssetId *)
             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffda5e,in_stack_ffffffffffffda58)),
             AVar6.amount_._7_1_);
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress(&local_16a0,&local_13d8);
  cfd::ConfidentialTransactionContext::AddTxOut
            ((ConfidentialTransactionContext *)in_stack_ffffffffffffd9f0,
             (Address *)
             CONCAT17(in_stack_ffffffffffffd9ef,
                      CONCAT16(in_stack_ffffffffffffd9ee,
                               CONCAT15(in_stack_ffffffffffffd9ed,in_stack_ffffffffffffd9e8))),
             (Amount *)in_stack_ffffffffffffd9e0,
             (ConfidentialAssetId *)
             CONCAT17(in_stack_ffffffffffffd9df,
                      CONCAT16(in_stack_ffffffffffffd9de,
                               CONCAT15(in_stack_ffffffffffffd9dd,
                                        CONCAT14(in_stack_ffffffffffffd9dc,
                                                 CONCAT13(in_stack_ffffffffffffd9db,
                                                          CONCAT12(in_stack_ffffffffffffd9da,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffd9d9,
                                                  in_stack_ffffffffffffd9d8))))))));
  cfd::core::Address::~Address
            ((Address *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980));
  cfd::core::ConfidentialTransaction::AddTxOutFee(local_14c8,&local_1410,local_2a8);
  cfd::UtxoData::UtxoData
            (in_stack_ffffffffffffd9f0,
             (UtxoData *)
             CONCAT17(in_stack_ffffffffffffd9ef,
                      CONCAT16(in_stack_ffffffffffffd9ee,
                               CONCAT15(in_stack_ffffffffffffd9ed,in_stack_ffffffffffffd9e8))));
  this_00 = local_1bb8;
  cfd::UtxoData::UtxoData
            (in_stack_ffffffffffffd9f0,
             (UtxoData *)
             CONCAT17(in_stack_ffffffffffffd9ef,
                      CONCAT16(in_stack_ffffffffffffd9ee,
                               CONCAT15(in_stack_ffffffffffffd9ed,in_stack_ffffffffffffd9e8))));
  local_16c8 = (undefined1 ****)local_20a8;
  local_16c0 = 2;
  std::allocator<cfd::UtxoData>::allocator((allocator<cfd::UtxoData> *)0x2268a7);
  __l._M_array._4_4_ = in_stack_ffffffffffffd9bc;
  __l._M_array._0_4_ = in_stack_ffffffffffffd9b8;
  __l._M_len._0_2_ = in_stack_ffffffffffffd9c0;
  __l._M_len._2_1_ = in_stack_ffffffffffffd9c2;
  __l._M_len._3_1_ = in_stack_ffffffffffffd9c3;
  __l._M_len._4_1_ = in_stack_ffffffffffffd9c4;
  __l._M_len._5_1_ = in_stack_ffffffffffffd9c5;
  __l._M_len._6_1_ = in_stack_ffffffffffffd9c6;
  __l._M_len._7_1_ = in_stack_ffffffffffffd9c7;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (in_stack_ffffffffffffd9b0,__l,
             (allocator_type *)
             CONCAT17(in_stack_ffffffffffffd9af,
                      CONCAT16(in_stack_ffffffffffffd9ae,
                               CONCAT15(in_stack_ffffffffffffd9ad,
                                        CONCAT14(in_stack_ffffffffffffd9ac,in_stack_ffffffffffffd9a8
                                                )))));
  std::allocator<cfd::UtxoData>::~allocator((allocator<cfd::UtxoData> *)0x2268db);
  local_25c8 = &local_16c8;
  do {
    local_25c8 = local_25c8 + -0x9e;
    cfd::UtxoData::~UtxoData
              ((UtxoData *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980));
  } while (local_25c8 != local_20a8);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::ConfidentialTransactionContext::CollectInputUtxo
                (in_stack_ffffffffffffe030,in_stack_ffffffffffffe028);
    }
  }
  else {
    testing::Message::Message((Message *)&stack0xffffffffffffdf40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffdf38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x306,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffdf38,(Message *)&stack0xffffffffffffdf40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffdf38);
    testing::Message::~Message((Message *)0x226b80);
  }
  pCVar8 = (ConfidentialTransactionContext *)&stack0xffffffffffffdf20;
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::vector((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
            *)0x226bdd);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
               *)in_stack_ffffffffffffd990,(value_type *)in_stack_ffffffffffffd988);
  uVar1 = testing::internal::AlwaysTrue();
  if ((bool)uVar1) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      in_R9 = (char *)0x0;
      cfd::ConfidentialTransactionContext::Blind
                (pCVar8,(vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
                         *)CONCAT17(uVar1,CONCAT16(bVar2,CONCAT15(in_stack_ffffffffffffd9ed,
                                                                  in_stack_ffffffffffffd9e8))),
                 (int64_t)in_stack_ffffffffffffd9e0,
                 CONCAT13(in_stack_ffffffffffffd9df,
                          CONCAT12(in_stack_ffffffffffffd9de,
                                   CONCAT11(in_stack_ffffffffffffd9dd,in_stack_ffffffffffffd9dc))),
                 CONCAT13(in_stack_ffffffffffffd9db,
                          CONCAT12(in_stack_ffffffffffffd9da,
                                   CONCAT11(in_stack_ffffffffffffd9d9,in_stack_ffffffffffffd9d8))),
                 in_stack_ffffffffffffd9d0);
    }
  }
  else {
    testing::Message::Message((Message *)&stack0xffffffffffffdf18);
    testing::internal::AssertHelper::AssertHelper
              (&local_20f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x30a,
               "Expected: txc.Blind(&ct_addrs) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_20f0,(Message *)&stack0xffffffffffffdf18);
    testing::internal::AssertHelper::~AssertHelper(&local_20f0);
    testing::Message::~Message((Message *)0x226d05);
  }
  cfd::core::ConfidentialTransaction::GetTxOutList(&local_2108,local_14c8);
  local_2120 = std::
               vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
               ::size(&local_2108);
  local_2124 = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_ffffffffffffd998,(char *)in_stack_ffffffffffffd990,
             &in_stack_ffffffffffffd988->block_height,
             (int *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980));
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2118);
  if (!bVar2) {
    testing::Message::Message(&local_2130);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x226e24);
    testing::internal::AssertHelper::AssertHelper
              (&local_2138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x30c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2138,&local_2130);
    testing::internal::AssertHelper::~AssertHelper(&local_2138);
    testing::Message::~Message((Message *)0x226e81);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x226ed9);
  sVar4 = std::
          vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
          ::size(&local_2108);
  if (sVar4 == 3) {
    std::
    vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
    ::operator[](&local_2108,0);
    cfd::core::ConfidentialTxOutReference::GetConfidentialValue(in_stack_ffffffffffffd978);
    local_2149 = cfd::core::ConfidentialValue::HasBlinding(&local_2178);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980),
               (bool *)in_stack_ffffffffffffd978,(type *)0x226f4c);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x226f5b);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2148);
    if (!bVar2) {
      testing::Message::Message(&local_2180);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_21a8,(internal *)&local_2148,
                 (AssertionResult *)"txouts[0].GetConfidentialValue().HasBlinding()","false","true",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_2188,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x30e,pcVar3);
      testing::internal::AssertHelper::operator=(&local_2188,&local_2180);
      testing::internal::AssertHelper::~AssertHelper(&local_2188);
      std::__cxx11::string::~string((string *)&local_21a8);
      testing::Message::~Message((Message *)0x227077);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2270f2);
    std::
    vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
    ::operator[](&local_2108,1);
    cfd::core::ConfidentialTxOutReference::GetConfidentialValue(in_stack_ffffffffffffd978);
    local_21b9 = cfd::core::ConfidentialValue::HasBlinding(&local_21e8);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980),
               (bool *)in_stack_ffffffffffffd978,(type *)0x22714f);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x22715e);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_21b8);
    if (!bVar2) {
      testing::Message::Message(&local_21f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_2218,(internal *)&local_21b8,
                 (AssertionResult *)"txouts[1].GetConfidentialValue().HasBlinding()","false","true",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_21f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x30f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_21f8,&local_21f0);
      testing::internal::AssertHelper::~AssertHelper(&local_21f8);
      std::__cxx11::string::~string((string *)&local_2218);
      testing::Message::~Message((Message *)0x22727a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2272f5);
    std::
    vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
    ::operator[](&local_2108,2);
    cfd::core::ConfidentialTxOutReference::GetConfidentialValue(in_stack_ffffffffffffd978);
    bVar2 = cfd::core::ConfidentialValue::HasBlinding(&local_2258);
    local_2229 = ~bVar2 & 1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980),
               (bool *)in_stack_ffffffffffffd978,(type *)0x227354);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x227363);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2228);
    if (!bVar2) {
      testing::Message::Message(&local_2260);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_2288,(internal *)&local_2228,
                 (AssertionResult *)"txouts[2].GetConfidentialValue().HasBlinding()","true","false",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_2268,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x310,pcVar3);
      testing::internal::AssertHelper::operator=(&local_2268,&local_2260);
      testing::internal::AssertHelper::~AssertHelper(&local_2268);
      std::__cxx11::string::~string((string *)&local_2288);
      testing::Message::~Message((Message *)0x22747f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2274f7);
  }
  cfd::core::ByteData::ByteData(&local_22a0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::OutPoint::OutPoint(&local_22c8,&local_4f8,local_4d8);
      paVar7 = &local_2301;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2300,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",paVar7);
      cfd::core::Pubkey::Pubkey(&local_22e0,&local_2300);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2348,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",
                 &local_2349);
      cfd::core::Privkey::FromWif(&local_2328,&local_2348,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_2358);
      cfd::ConfidentialTransactionContext::SignWithKey
                ((ConfidentialTransactionContext *)this_00,(OutPoint *)in_stack_ffffffffffffdf48,
                 (Pubkey *)in_stack_ffffffffffffdf40.ptr_,(Privkey *)in_stack_ffffffffffffdf38.data_
                 ,(SigHashType *)in_stack_ffffffffffffdf30,(bool)in_stack_ffffffffffffdf2f);
      cfd::core::Privkey::~Privkey((Privkey *)0x227648);
      std::__cxx11::string::~string((string *)&local_2348);
      std::allocator<char>::~allocator((allocator<char> *)&local_2349);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x22766f);
      std::__cxx11::string::~string((string *)&local_2300);
      std::allocator<char>::~allocator((allocator<char> *)&local_2301);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x227696);
    }
  }
  else {
    testing::Message::Message(&local_2360);
    testing::internal::AssertHelper::AssertHelper
              (&local_2368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x318,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2368,&local_2360);
    testing::internal::AssertHelper::~AssertHelper(&local_2368);
    testing::Message::~Message((Message *)0x227828);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::OutPoint::OutPoint(&local_2390,&local_4f8,local_4d8);
      cfd::ConfidentialTransactionContext::Verify
                (in_stack_ffffffffffffdf20,(OutPoint *)in_stack_ffffffffffffdf18.ptr_);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2278e5);
    }
  }
  else {
    testing::Message::Message(&local_2398);
    testing::internal::AssertHelper::AssertHelper
              (&local_23a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x319,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_23a0,&local_2398);
    testing::internal::AssertHelper::~AssertHelper(&local_23a0);
    testing::Message::~Message((Message *)0x2279af);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(&local_23a8,"");
  bVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_23a8);
  if (bVar2) {
    local_23a9 = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::ConfidentialTransactionContext::Finalize
                ((ConfidentialTransactionContext *)in_stack_ffffffffffffd988);
      cfd::core::ByteData::operator=
                ((ByteData *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980),
                 (ByteData *)in_stack_ffffffffffffd978);
      cfd::core::ByteData::~ByteData((ByteData *)0x227a89);
    }
    if ((local_23a9 & 1) != 0) goto LAB_00227bdf;
    local_23a8.value =
         "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_23d8);
  testing::internal::AssertHelper::AssertHelper
            (&local_23e0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
             ,0x31b,local_23a8.value);
  testing::internal::AssertHelper::operator=(&local_23e0,local_23d8);
  testing::internal::AssertHelper::~AssertHelper(&local_23e0);
  testing::Message::~Message((Message *)0x227b94);
LAB_00227bdf:
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::OutPoint::OutPoint(&local_2408,&local_ca0,local_c80);
      paVar7 = &local_2441;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2440,
                 "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27",paVar7);
      cfd::core::Pubkey::Pubkey(&local_2420,&local_2440);
      paVar7 = &local_2489;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2488,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP",paVar7
                );
      cfd::core::Privkey::FromWif(&local_2468,&local_2488,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_2498);
      cfd::ConfidentialTransactionContext::SignWithKey
                ((ConfidentialTransactionContext *)this_00,(OutPoint *)in_stack_ffffffffffffdf48,
                 (Pubkey *)in_stack_ffffffffffffdf40.ptr_,(Privkey *)in_stack_ffffffffffffdf38.data_
                 ,(SigHashType *)in_stack_ffffffffffffdf30,(bool)in_stack_ffffffffffffdf2f);
      cfd::core::Privkey::~Privkey((Privkey *)0x227d0d);
      std::__cxx11::string::~string((string *)&local_2488);
      std::allocator<char>::~allocator((allocator<char> *)&local_2489);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x227d34);
      std::__cxx11::string::~string((string *)&local_2440);
      std::allocator<char>::~allocator((allocator<char> *)&local_2441);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x227d5b);
    }
  }
  else {
    testing::Message::Message(&local_24a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_24a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,800,
               "Expected: txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout), Pubkey(\"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27\"), Privkey::FromWif( \"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_24a8,&local_24a0);
    testing::internal::AssertHelper::~AssertHelper(&local_24a8);
    testing::Message::~Message((Message *)0x227ed4);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::OutPoint::OutPoint(&local_24d0,&local_ca0,local_c80);
      cfd::ConfidentialTransactionContext::Verify
                (in_stack_ffffffffffffdf20,(OutPoint *)in_stack_ffffffffffffdf18.ptr_);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x227f91);
    }
  }
  else {
    testing::Message::Message(&local_24d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_24e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x321,
               "Expected: txc.Verify(OutPoint(utxo2.txid, utxo2.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_24e0,&local_24d8);
    testing::internal::AssertHelper::~AssertHelper(&local_24e0);
    testing::Message::~Message((Message *)0x22805b);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::ConfidentialTransactionContext::Finalize
                ((ConfidentialTransactionContext *)in_stack_ffffffffffffd988);
      cfd::core::ByteData::operator=
                ((ByteData *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980),
                 (ByteData *)in_stack_ffffffffffffd978);
      cfd::core::ByteData::~ByteData((ByteData *)0x22810c);
    }
  }
  else {
    testing::Message::Message(local_2500);
    testing::internal::AssertHelper::AssertHelper
              (&local_2508,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x322,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_2508,local_2500);
    testing::internal::AssertHelper::~AssertHelper(&local_2508);
    testing::Message::~Message((Message *)0x2281b3);
  }
  sVar5 = cfd::core::ByteData::GetDataSize(&local_22a0);
  if (((sVar5 != 0x23e1) &&
      (pcVar3 = (char *)cfd::core::ByteData::GetDataSize(&local_22a0), pcVar3 != (char *)0x23e2)) &&
     (in_stack_ffffffffffffd990 =
           (ConfidentialTransactionContext *)cfd::core::ByteData::GetDataSize(&local_22a0),
     in_stack_ffffffffffffd990 != (ConfidentialTransactionContext *)0x23e3)) {
    local_251c = 0;
    local_2528 = (int *)cfd::core::ByteData::GetDataSize(&local_22a0);
    testing::internal::EqHelper<true>::Compare<int,unsigned_long>
              (pcVar3,(char *)in_stack_ffffffffffffd990,local_2528,
               (unsigned_long *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980),
               in_stack_ffffffffffffd978);
    in_stack_ffffffffffffd987 = testing::AssertionResult::operator_cast_to_bool(&local_2518);
    if (!(bool)in_stack_ffffffffffffd987) {
      testing::Message::Message(&local_2530);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x228322);
      testing::internal::AssertHelper::AssertHelper
                (&local_2538,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x325,pcVar3);
      testing::internal::AssertHelper::operator=(&local_2538,&local_2530);
      testing::internal::AssertHelper::~AssertHelper(&local_2538);
      testing::Message::~Message((Message *)0x22837d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2283d2);
  }
  cfd::core::ByteData::~ByteData((ByteData *)0x2283f3);
  std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::~vector((vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
             *)in_stack_ffffffffffffd990);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::~vector((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
             *)in_stack_ffffffffffffd990);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffd990);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)
             CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980));
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)
             CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980));
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)
             CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980));
  cfd::UtxoData::~UtxoData
            ((UtxoData *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980));
  cfd::UtxoData::~UtxoData
            ((UtxoData *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980));
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x228468);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, SequenceApiTestWithKey)
{
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph");
  utxo1.descriptor = "pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo1.amount = Amount(int64_t{10000000});
  utxo1.address_type = AddressType::kP2pkhAddress;
  utxo1.asset = ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  // utxo1.asset_blind_factor = BlindFactor("");
  // utxo1.amount_blind_factor = BlindFactor("");
  // utxo1.value_commitment = ConfidentialValue("");

  // Address2 (pattern-x1)
  // pubkey: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  // blinding key: '66e4df5035a64acef16b4aa52ddc8bebd22b22c9eca150774e355abc72909d83'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 0;
  utxo2.locking_script = Script("a9145d54db96a28f844a744e393fcd699d6f825b284187");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE");
  utxo2.descriptor = "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))";
  utxo2.amount = Amount(int64_t{180000});
  utxo2.address_type = AddressType::kP2shP2wpkhAddress;
  utxo2.asset = ConfidentialAssetId("849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735");
  // utxo2.confidential_address;
  utxo2.asset_blind_factor = BlindFactor("23b44363de1069842dff58ac6c965f75af71949e58d823d7bfcc963134db0b3e");
  utxo2.amount_blind_factor = BlindFactor("6dfe8c49f10c40cac178da4056dbf55eb11fa26e3169f41019e88252d86c42bc");
  utxo2.value_commitment = ConfidentialValue("09da970d871982c2405b2d4bff4f455e4907bedaf95c205f94015809f6bd9c59fa");

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  ElementsConfidentialAddress address("CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3ggeFikyDxDW5gU8WmTXtb2HWWjc23YXZz");
  // "2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z"
  ElementsConfidentialAddress asset_address("CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3VHXTF8dZAhKb1iBAnzYXEj527CSdfj2PS");

  Amount fee(int64_t{10000});
  ConfidentialTransactionContext txc(2, 0);
  EXPECT_NO_THROW(txc.AddInput(utxo1));
  txc.AddTxIn(OutPoint(utxo2.txid, utxo2.vout));
  txc.AddTxOut(address, utxo1.amount - fee, utxo1.asset);
  txc.AddTxOut(asset_address.GetUnblindedAddress(), utxo2.amount, utxo2.asset);
  txc.AddTxOutFee(fee, utxo1.asset);

  std::vector<cfd::UtxoData> utxos{utxo1, utxo2};
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  std::vector<cfd::core::ElementsConfidentialAddress> ct_addrs;
  ct_addrs.push_back(asset_address);
  EXPECT_NO_THROW(txc.Blind(&ct_addrs));
  std::vector<ConfidentialTxOutReference> txouts = txc.GetTxOutList();
  EXPECT_EQ(txouts.size(), 3);
  if (txouts.size() == 3) {
    EXPECT_TRUE(txouts[0].GetConfidentialValue().HasBlinding());
    EXPECT_TRUE(txouts[1].GetConfidentialValue().HasBlinding());
    EXPECT_FALSE(txouts[2].GetConfidentialValue().HasBlinding());
  }

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));

  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout),
      Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
      Privkey::FromWif(
          "cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo2.txid, utxo2.vout)));
  EXPECT_NO_THROW(tx = txc.Finalize());

  if ((tx.GetDataSize() != 9185) && (tx.GetDataSize() != 9186) && (tx.GetDataSize() != 9187)) {
    EXPECT_EQ(0, tx.GetDataSize());
  }
}